

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
dynet::MatrixMultiply::backward_dev_impl<dynet::Device_CPU>
          (MatrixMultiply *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  uint uVar1;
  const_reference ppTVar2;
  uint *puVar3;
  vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *in_RDX;
  long in_R8;
  uint in_R9D;
  long in_stack_00000008;
  int b_1;
  int b;
  int max_b;
  MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffc88;
  DenseBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_> *this_00;
  MatrixBase<Eigen::Transpose<const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *in_stack_fffffffffffffca0;
  MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffca8;
  NoAlias<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::MatrixBase>
  *in_stack_fffffffffffffcb0;
  Tensor *in_stack_fffffffffffffcb8;
  NoAlias<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::MatrixBase>
  in_stack_fffffffffffffcc0;
  uint uVar4;
  Tensor *in_stack_fffffffffffffcc8;
  int local_294;
  int local_fc;
  
  if (in_R9D < 2) {
    ppTVar2 = std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[]
                        (in_RDX,0);
    this_00 = (DenseBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
               *)&((*ppTVar2)->d).bd;
    ppTVar2 = std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[]
                        (in_RDX,1);
    puVar3 = std::max<unsigned_int>((uint *)this_00,&((*ppTVar2)->d).bd);
    uVar1 = *puVar3;
    if (in_R9D == 0) {
      if ((*(int *)(in_stack_00000008 + 0x20) == 1) &&
         (uVar4 = *(uint *)(in_R8 + 0x20),
         ppTVar2 = std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::
                   operator[](in_RDX,1), uVar4 == ((*ppTVar2)->d).bd)) {
        Tensor::colbatch_matrix(in_stack_fffffffffffffcc8);
        std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[]
                  (in_RDX,1);
        Tensor::colbatch_matrix(in_stack_fffffffffffffcc8);
        Eigen::
        DenseBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::
        transpose(this_00);
        Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>>::
        operator*(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
        Tensor::operator*(in_stack_fffffffffffffcb8);
        Eigen::
        MatrixBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::
        noalias(in_stack_fffffffffffffc88);
        Eigen::
        NoAlias<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::MatrixBase>
        ::operator+=(in_stack_fffffffffffffcb0,
                     (MatrixBase<Eigen::Product<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Transpose<const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_0>_>
                      *)in_stack_fffffffffffffca8);
      }
      else {
        for (local_fc = 0; local_fc < (int)uVar1; local_fc = local_fc + 1) {
          Tensor::batch_matrix
                    (in_stack_fffffffffffffcc8,
                     (uint)((ulong)in_stack_fffffffffffffcc0.m_expression >> 0x20));
          std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[]
                    (in_RDX,1);
          Tensor::batch_matrix
                    (in_stack_fffffffffffffcc8,
                     (uint)((ulong)in_stack_fffffffffffffcc0.m_expression >> 0x20));
          Eigen::
          DenseBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::
          transpose(this_00);
          Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>>::
          operator*(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
          Tensor::batch_matrix
                    (in_stack_fffffffffffffcc8,
                     (uint)((ulong)in_stack_fffffffffffffcc0.m_expression >> 0x20));
          Eigen::
          MatrixBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>
          ::noalias(in_stack_fffffffffffffc88);
          Eigen::
          NoAlias<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::MatrixBase>
          ::operator+=(in_stack_fffffffffffffcb0,
                       (MatrixBase<Eigen::Product<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Transpose<const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_0>_>
                        *)in_stack_fffffffffffffca8);
        }
      }
    }
    else {
      ppTVar2 = std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::
                operator[](in_RDX,0);
      if (((*ppTVar2)->d).bd == 1) {
        std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[]
                  (in_RDX,0);
        Tensor::operator*(in_stack_fffffffffffffcb8);
        Eigen::
        DenseBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::
        transpose(this_00);
        Tensor::colbatch_matrix(in_stack_fffffffffffffcc8);
        Eigen::
        MatrixBase<Eigen::Transpose<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>const>>
        ::operator*((MatrixBase<Eigen::Transpose<const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
                     *)in_stack_fffffffffffffca8,
                    (MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                     *)in_stack_fffffffffffffca0);
        Tensor::colbatch_matrix(in_stack_fffffffffffffcc8);
        Eigen::
        MatrixBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::
        noalias(in_stack_fffffffffffffc88);
        Eigen::
        NoAlias<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::MatrixBase>
        ::operator+=(in_stack_fffffffffffffcb0,
                     (MatrixBase<Eigen::Product<Eigen::Transpose<const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                      *)in_stack_fffffffffffffca8);
      }
      else {
        for (local_294 = 0; uVar4 = (uint)((ulong)in_stack_fffffffffffffcc0.m_expression >> 0x20),
            local_294 < (int)uVar1; local_294 = local_294 + 1) {
          std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[]
                    (in_RDX,0);
          Tensor::batch_matrix(in_stack_fffffffffffffcc8,uVar4);
          Eigen::
          DenseBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::
          transpose(this_00);
          Tensor::batch_matrix(in_stack_fffffffffffffcc8,uVar4);
          Eigen::
          MatrixBase<Eigen::Transpose<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>const>>
          ::operator*((MatrixBase<Eigen::Transpose<const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
                       *)in_stack_fffffffffffffca8,
                      (MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                       *)in_stack_fffffffffffffca0);
          Tensor::batch_matrix(in_stack_fffffffffffffcc8,uVar4);
          in_stack_fffffffffffffcc0 =
               Eigen::
               MatrixBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>
               ::noalias(in_stack_fffffffffffffc88);
          Eigen::
          NoAlias<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::MatrixBase>
          ::operator+=(in_stack_fffffffffffffcb0,
                       (MatrixBase<Eigen::Product<Eigen::Transpose<const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                        *)in_stack_fffffffffffffca8);
        }
      }
    }
    return;
  }
  __assert_fail("i < 2",
                "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/nodes.cc"
                ,0x463,
                "void dynet::MatrixMultiply::backward_dev_impl(const MyDevice &, const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const [MyDevice = dynet::Device_CPU]"
               );
}

Assistant:

void MatrixMultiply::backward_dev_impl(const MyDevice & dev,
                             const vector<const Tensor*>& xs,
                             const Tensor& fx,
                             const Tensor& dEdf,
                             unsigned i,
                             Tensor& dEdxi) const {
  assert(i < 2);
  int max_b = max(xs[0]->d.bd, xs[1]->d.bd);
#if __CUDACC__
  if (i == 0) {
    if(dEdxi.d.bd == 1 && (dEdf.d.bd == xs[1]->d.bd)) {
      CUBLAS_CHECK(cublasSgemm(dev.cublas_handle, CUBLAS_OP_N, CUBLAS_OP_T,
            dEdxi.d.rows(), dEdxi.d.cols(), dEdf.d.cols() * dEdf.d.batch_elems(),
            kSCALAR_ONE,
            dEdf.v, dEdf.d.rows(),
            xs[1]->v, xs[1]->d.rows(),
            kSCALAR_ONE, dEdxi.v, dEdxi.d.rows()));
    } else {
      for(int b = 0; b < max_b; ++b)
        CUBLAS_CHECK(cublasSgemm(dev.cublas_handle, CUBLAS_OP_N, CUBLAS_OP_T,
              dEdxi.d.rows(), dEdxi.d.cols(), dEdf.d.cols(),
              kSCALAR_ONE,
              dEdf.batch_ptr(b), dEdf.d.rows(),
              xs[1]->batch_ptr(b), xs[1]->d.rows(),
              kSCALAR_ONE, dEdxi.batch_ptr(b), dEdxi.d.rows()));
    }
  } else {
    // Do a single multiply if xs[0] has one batch
    if(xs[0]->d.bd == 1) {
      // dEdxi.colbatch_matrix().noalias() += (**xs[0]).transpose() * dEdf.colbatch_matrix();
      CUBLAS_CHECK(cublasSgemm(dev.cublas_handle, CUBLAS_OP_T, CUBLAS_OP_N,
            dEdxi.d.rows(), dEdxi.d.cols()*dEdxi.d.batch_elems(), xs[0]->d.rows(),
            kSCALAR_ONE,
            xs[0]->v, xs[0]->d.rows(),
            dEdf.v, dEdf.d.rows(),
            kSCALAR_ONE, dEdxi.v, dEdxi.d.rows()));
    } else {
      for(int b = 0; b < max_b; ++b)
        CUBLAS_CHECK(cublasSgemm(dev.cublas_handle, CUBLAS_OP_T, CUBLAS_OP_N,
              dEdxi.d.rows(), dEdxi.d.cols(), xs[0]->d.rows(),
              kSCALAR_ONE,
              xs[0]->batch_ptr(b), xs[0]->d.rows(),
              dEdf.batch_ptr(b), dEdf.d.rows(),
              kSCALAR_ONE, dEdxi.batch_ptr(b), dEdxi.d.rows()));
    }
  }
#else
  if (i == 0) {
    if(dEdxi.d.bd == 1 && (dEdf.d.bd == xs[1]->d.bd)) {
      (*dEdxi).noalias() += dEdf.colbatch_matrix() * xs[1]->colbatch_matrix().transpose();
    } else {
      for(int b = 0; b < max_b; ++b)
        dEdxi.batch_matrix(b).noalias() += dEdf.batch_matrix(b) * xs[1]->batch_matrix(b).transpose();
    }
  } else {
    if(xs[0]->d.bd == 1) {
      dEdxi.colbatch_matrix().noalias() += (**xs[0]).transpose() * dEdf.colbatch_matrix();
    } else {
      for(int b = 0; b < max_b; ++b)
        dEdxi.batch_matrix(b).noalias() += xs[0]->batch_matrix(b).transpose() * dEdf.batch_matrix(b);
    }
  }
#endif
}